

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmmaparena.h
# Opt level: O0

void * __thiscall cookmem::MmapArena::getSegment(MmapArena *this,size_t *size)

{
  void *ptr;
  size_t *size_local;
  MmapArena *this_local;
  
  if (*size < this->m_minSize) {
    *size = this->m_minSize;
  }
  this_local = (MmapArena *)mmap((void *)0x0,*size,this->m_prot,this->m_flag,-1,0);
  if (this_local == (MmapArena *)0xffffffffffffffff) {
    this_local = (MmapArena *)0x0;
  }
  return this_local;
}

Assistant:

void*
    getSegment (std::size_t& size)
    {
        if (size < m_minSize)
        {
            size = m_minSize;
        }
        void* ptr = mmap(nullptr, size, m_prot, m_flag, -1, 0);
        if (ptr == MAP_FAILED)
        {
            return nullptr;
        }
        return ptr;
    }